

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
::~Set_column(Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
              *this)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  node_ptr next;
  _Rb_tree_node_base *p_Var4;
  
  for (p_Var4 = (this->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->column_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    pvVar1 = *(void **)(p_Var4 + 1);
    if (((this->super_Row_access_option).rows_ != (Row_container *)0x0) &&
       (lVar2 = *(long *)((long)pvVar1 + 8), lVar2 != 0)) {
      plVar3 = *(long **)((long)pvVar1 + 0x10);
      *plVar3 = lVar2;
      *(long **)(lVar2 + 8) = plVar3;
      *(undefined8 *)((long)pvVar1 + 8) = 0;
      *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    }
    if (pvVar1 != (void *)0x0) {
      lVar2 = *(long *)((long)pvVar1 + 8);
      if (lVar2 != 0) {
        plVar3 = *(long **)((long)pvVar1 + 0x10);
        *plVar3 = lVar2;
        *(long **)(lVar2 + 8) = plVar3;
        *(undefined8 *)((long)pvVar1 + 8) = 0;
        *(undefined8 *)((long)pvVar1 + 0x10) = 0;
      }
      operator_delete(pvVar1,0x20);
    }
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>_>
  ::~_Rb_tree(&(this->column_)._M_t);
  return;
}

Assistant:

inline Set_column<Master_matrix>::~Set_column()
{
  for (auto* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::unlink(entry);
    entryPool_->destroy(entry);
  }
}